

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::endMode(TestSpecParser *this)

{
  TestSpecParser *this_local;
  
  switch(this->m_mode) {
  case None:
  default:
    startNewMode(this,None);
    break;
  case Name:
  case QuotedName:
    addNamePattern(this);
    break;
  case Tag:
    addTagPattern(this);
    break;
  case EscapedName:
    revertBackToLastMode(this);
  }
  return;
}

Assistant:

void TestSpecParser::endMode() {
        switch( m_mode ) {
        case Name:
        case QuotedName:
            return addNamePattern();
        case Tag:
            return addTagPattern();
        case EscapedName:
            revertBackToLastMode();
            return;
        case None:
        default:
            return startNewMode( None );
        }
    }